

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTxIn::AbstractTxIn
          (AbstractTxIn *this,Txid *txid,uint32_t index,uint32_t sequence)

{
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  AbstractTxIn *this_local;
  
  this->_vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_009f0d30;
  Txid::Txid(&this->txid_,txid);
  this->vout_ = index;
  Script::Script(&this->unlocking_script_);
  this->sequence_ = sequence;
  ScriptWitness::ScriptWitness(&this->script_witness_);
  return;
}

Assistant:

AbstractTxIn::AbstractTxIn(const Txid &txid, uint32_t index, uint32_t sequence)
    : txid_(txid),
      vout_(index),
      unlocking_script_(),
      sequence_(sequence),
      script_witness_() {
  // do nothing
}